

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowValueGlobalState::Finalize(WindowValueGlobalState *this,CollectionPtr collection)

{
  WindowCollection *pWVar1;
  reference pvVar2;
  optional_ptr<duckdb::WindowCollection,_true> local_18;
  
  local_18.ptr = collection.ptr;
  ::std::mutex::lock(&this->lock);
  if ((this->child_idx != 0xffffffffffffffff) &&
     (((this->super_WindowExecutorGlobalState).executor)->wexpr->ignore_nulls == true)) {
    pWVar1 = optional_ptr<duckdb::WindowCollection,_true>::operator->(&local_18);
    pvVar2 = vector<duckdb::ValidityMask,_true>::get<true>(&pWVar1->validities,this->child_idx);
    (this->ignore_nulls).ptr = pvVar2;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void Finalize(CollectionPtr collection) {
		lock_guard<mutex> ignore_nulls_guard(lock);
		if (child_idx != DConstants::INVALID_INDEX && executor.wexpr.ignore_nulls) {
			ignore_nulls = &collection->validities[child_idx];
		}
	}